

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O3

void soplex::SPxEquiliSC<double>::computeEquiExpVec
               (SVSetBase<double> *vecset,DataArray<int> *coScaleExp,DataArray<int> *scaleExp,
               double epsilon)

{
  int iVar1;
  Item *pIVar2;
  Nonzero<double> *pNVar3;
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  
  if (0 < (vecset->set).thenum) {
    lVar7 = 0;
    do {
      pIVar2 = (vecset->set).theitem;
      iVar1 = (vecset->set).thekey[lVar7].idx;
      dVar9 = 0.0;
      if (0 < pIVar2[iVar1].data.super_SVectorBase<double>.memused) {
        pIVar2 = pIVar2 + iVar1;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        lVar6 = 8;
        lVar5 = 0;
        do {
          pNVar3 = (pIVar2->data).super_SVectorBase<double>.m_elem;
          dVar9 = ldexp(*(double *)((long)pNVar3 + lVar6 + -8),
                        coScaleExp->data[*(int *)((long)&pNVar3->val + lVar6)]);
          auVar10._12_4_ = uVar14;
          auVar10._8_4_ = uVar13;
          uVar8 = -(ulong)(epsilon < ABS(dVar9) - (double)CONCAT44(uVar12,uVar11));
          auVar10._0_8_ = ~uVar8 & CONCAT44(uVar12,uVar11);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (ulong)ABS(dVar9) & uVar8;
          auVar10 = auVar10 | auVar4;
          dVar9 = auVar10._0_8_;
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + 0x10;
          uVar11 = auVar10._0_4_;
          uVar12 = auVar10._4_4_;
          uVar13 = auVar10._8_4_;
          uVar14 = auVar10._12_4_;
        } while (lVar5 < (pIVar2->data).super_SVectorBase<double>.memused);
      }
      frexp((double)(-(ulong)(dVar9 == 0.0) & 0x3ff0000000000000 |
                    ~-(ulong)(dVar9 == 0.0) & (ulong)(1.0 / dVar9)),scaleExp->data + lVar7);
      scaleExp->data[lVar7] = scaleExp->data[lVar7] + -1;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (vecset->set).thenum);
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::computeEquiExpVec(const SVSetBase<R>* vecset, const DataArray<int>& coScaleExp,
                                       DataArray<int>& scaleExp, R epsilon)
{
   assert(vecset != nullptr);

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(spxLdexp(vec.value(j), coScaleExp[vec.index(j)]));

         if(GT(x, maxi, epsilon))
            maxi = x;
      }

      // empty rows/cols are possible
      if(maxi == 0.0)
         maxi = 1.0;

      assert(maxi > 0.0);

      spxFrexp(Real(1.0 / maxi), &(scaleExp[i]));

      scaleExp[i] -= 1;
   }
}